

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LabelCase::iterate(LabelCase *this)

{
  ostringstream *poVar1;
  GLenum GVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  deBool dVar6;
  undefined4 extraout_var;
  size_t sVar8;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint object;
  int outlen;
  char buffer [64];
  undefined4 local_1f0;
  int local_1ec;
  char local_1e8 [60];
  uint uStack_1ac;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar7;
  
  bVar4 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x698);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  local_1f0 = 0;
  local_1ec = -1;
  GVar2 = this->m_identifier;
  if ((int)GVar2 < 0x8d40) {
    switch(GVar2) {
    case 0x82e0:
      (**(code **)(lVar7 + 0x6c8))(1,&local_1f0);
      (**(code **)(lVar7 + 0x40))(0x8892,local_1f0);
      (**(code **)(lVar7 + 0x40))(0x8892,0);
      break;
    case 0x82e1:
      local_1f0 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
      break;
    case 0x82e2:
      local_1f0 = (**(code **)(lVar7 + 0x3c8))();
      break;
    case 0x82e3:
      (**(code **)(lVar7 + 0x6e0))(1,&local_1f0);
      (**(code **)(lVar7 + 0x20))(0x8c2f,local_1f0);
      (**(code **)(lVar7 + 0x628))(0x8c2f);
      break;
    case 0x82e4:
      (**(code **)(lVar7 + 0x6d8))(1,&local_1f0);
      (**(code **)(lVar7 + 0x98))(local_1f0);
      (**(code **)(lVar7 + 0x98))(0);
      break;
    case 0x82e5:
      break;
    case 0x82e6:
      (**(code **)(lVar7 + 0x6f0))(1,&local_1f0);
      (**(code **)(lVar7 + 0xa8))(0,local_1f0);
      (**(code **)(lVar7 + 0xa8))(0,0);
      break;
    default:
      if (GVar2 == 0x1702) {
        (**(code **)(lVar7 + 0x6f8))(1,&local_1f0);
        (**(code **)(lVar7 + 0xb8))(0xde1,local_1f0);
        (**(code **)(lVar7 + 0xb8))(0xde1,0);
      }
    }
  }
  else if (GVar2 == 0x8d40) {
    (**(code **)(lVar7 + 0x6d0))(1,&local_1f0);
    (**(code **)(lVar7 + 0x78))(0x8ca9,local_1f0);
    pcVar3 = *(code **)(lVar7 + 0x78);
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
    (*pcVar3)(0x8ca9,iVar5);
  }
  else if (GVar2 == 0x8d41) {
    (**(code **)(lVar7 + 0x6e8))(1,&local_1f0);
    (**(code **)(lVar7 + 0xa0))(0x8d41,local_1f0);
    (**(code **)(lVar7 + 0xa0))(0x8d41,0);
  }
  else if (GVar2 == 0x8e22) {
    (**(code **)(lVar7 + 0x700))(1,&local_1f0);
    (**(code **)(lVar7 + 0xd0))(0x8e22,local_1f0);
    (**(code **)(lVar7 + 0xd0))(0x8e22,0);
  }
  (**(code **)(lVar7 + 0xfc0))(this->m_identifier,local_1f0,0xffffffff,"This is a debug label");
  builtin_strncpy(local_1e8 + 0x30,"XXXXXXXXXXXX",0xc);
  uStack_1ac = 0x58585858;
  builtin_strncpy(local_1e8 + 0x20,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(local_1e8 + 0x10,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(local_1e8,"XXXXXXXXXXXXXXXX",0x10);
  (**(code **)(lVar7 + 0x958))(this->m_identifier,local_1f0,0x40,&local_1ec);
  if (local_1ec == 0) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Failed to query debug label from object";
  }
  else {
    dVar6 = deStringEqual("This is a debug label",local_1e8);
    if (dVar6 != 0) {
      local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Query returned string: \"",0x18);
      sVar8 = strlen(local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1e8,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_013e1b59;
    }
    uStack_1ac = uStack_1ac & 0xffffff;
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Query returned wrong string: expected \"",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\" but got \"",0xb);
    sVar8 = strlen(local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1e8,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_128);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Query returned wrong label";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_013e1b59:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  GVar2 = this->m_identifier;
  if ((int)GVar2 < 0x8d40) {
    switch(GVar2) {
    case 0x82e0:
      (**(code **)(lVar7 + 0x438))(1,&local_1f0);
      break;
    case 0x82e1:
      (**(code **)(lVar7 + 0x470))(local_1f0);
      break;
    case 0x82e2:
      (**(code **)(lVar7 + 0x448))(local_1f0);
      break;
    case 0x82e3:
      (**(code **)(lVar7 + 0x458))(1,&local_1f0);
      break;
    case 0x82e4:
      (**(code **)(lVar7 + 0x450))(1,&local_1f0);
      break;
    case 0x82e5:
      break;
    case 0x82e6:
      (**(code **)(lVar7 + 0x468))(1,&local_1f0);
      break;
    default:
      if (GVar2 == 0x1702) {
        (**(code **)(lVar7 + 0x480))(1,&local_1f0);
      }
    }
  }
  else if (GVar2 == 0x8d40) {
    (**(code **)(lVar7 + 0x440))(1,&local_1f0);
  }
  else if (GVar2 == 0x8d41) {
    (**(code **)(lVar7 + 0x460))(1,&local_1f0);
  }
  else if (GVar2 == 0x8e22) {
    (**(code **)(lVar7 + 0x488))(1,&local_1f0);
  }
  return STOP;
}

Assistant:

LabelCase::IterateResult LabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const char*	const		msg			= "This is a debug label";
	GLuint					object		= 0;
	int						outlen		= -1;
	char					buffer[64];

	switch(m_identifier)
	{
		case GL_BUFFER:
			gl.genBuffers(1, &object);
			gl.bindBuffer(GL_ARRAY_BUFFER, object);
			gl.bindBuffer(GL_ARRAY_BUFFER, 0);
			break;

		case GL_SHADER:
			object = gl.createShader(GL_FRAGMENT_SHADER);
			break;

		case GL_PROGRAM:
			object = gl.createProgram();
			break;

		case GL_QUERY:
			gl.genQueries(1, &object);
			gl.beginQuery(GL_ANY_SAMPLES_PASSED, object); // Create
			gl.endQuery(GL_ANY_SAMPLES_PASSED); // Cleanup
			break;

		case GL_PROGRAM_PIPELINE:
			gl.genProgramPipelines(1, &object);
			gl.bindProgramPipeline(object); // Create
			gl.bindProgramPipeline(0); // Cleanup
			break;

		case GL_TRANSFORM_FEEDBACK:
			gl.genTransformFeedbacks(1, &object);
			gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, object);
			gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
			break;

		case GL_SAMPLER:
			gl.genSamplers(1, &object);
			gl.bindSampler(0, object);
			gl.bindSampler(0, 0);
			break;

		case GL_TEXTURE:
			gl.genTextures(1, &object);
			gl.bindTexture(GL_TEXTURE_2D, object);
			gl.bindTexture(GL_TEXTURE_2D, 0);
			break;

		case GL_RENDERBUFFER:
			gl.genRenderbuffers(1, &object);
			gl.bindRenderbuffer(GL_RENDERBUFFER, object);
			gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
			break;

		case GL_FRAMEBUFFER:
			gl.genFramebuffers(1, &object);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, object);
			gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
			break;

		default:
			DE_FATAL("Invalid identifier");
	}

	gl.objectLabel(m_identifier, object, -1, msg);

	deMemset(buffer, 'X', sizeof(buffer));
	gl.getObjectLabel(m_identifier, object, sizeof(buffer), &outlen, buffer);

	if (outlen == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to query debug label from object");
	else if (deStringEqual(msg, buffer))
	{
		m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		buffer[63] = '\0'; // make sure buffer is null terminated before printing
		m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << msg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query returned wrong label");
	}

	switch(m_identifier)
	{
		case GL_BUFFER:				gl.deleteBuffers(1, &object);				break;
		case GL_SHADER:				gl.deleteShader(object);					break;
		case GL_PROGRAM:			gl.deleteProgram(object);					break;
		case GL_QUERY:				gl.deleteQueries(1, &object);				break;
		case GL_PROGRAM_PIPELINE:	gl.deleteProgramPipelines(1, &object);		break;
		case GL_TRANSFORM_FEEDBACK:	gl.deleteTransformFeedbacks(1, &object);	break;
		case GL_SAMPLER:			gl.deleteSamplers(1, &object);				break;
		case GL_TEXTURE:			gl.deleteTextures(1, &object);				break;
		case GL_RENDERBUFFER:		gl.deleteRenderbuffers(1, &object);			break;
		case GL_FRAMEBUFFER:		gl.deleteFramebuffers(1, &object);			break;

		default:
			DE_FATAL("Invalid identifier");
	}

	return STOP;
}